

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_QueueSetOutputMatrix
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,uint32_t SourceChannels,
               uint32_t DestinationChannels,float *pLevelMatrix,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  float *pfVar2;
  float in_ECX;
  float in_EDX;
  FAudioVoice *in_RSI;
  long *in_RDI;
  FAudioVoice *in_R8;
  FAudio_OPERATIONSET_Type in_R9D;
  FAudio_OPERATIONSET_Operation *op;
  uint32_t in_stack_ffffffffffffffd8;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x135401);
  pFVar1 = QueueOperation(in_R8,in_R9D,in_stack_ffffffffffffffd8);
  (pFVar1->Data).SetOutputFilterParameters.pDestinationVoice = in_RSI;
  (pFVar1->Data).SetFilterParameters.Parameters.OneOverQ = in_EDX;
  (pFVar1->Data).SetOutputFilterParameters.Parameters.Frequency = in_ECX;
  pfVar2 = (float *)(**(code **)(*in_RDI + 0xb8))((ulong)(uint)in_EDX * 4 * (ulong)(uint)in_ECX);
  (pFVar1->Data).SetOutputMatrix.pLevelMatrix = pfVar2;
  SDL_memcpy((pFVar1->Data).SetOutputMatrix.pLevelMatrix,in_R8,
             (ulong)(uint)in_EDX * 4 * (ulong)(uint)in_ECX);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1354a4);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetOutputMatrix(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	uint32_t SourceChannels,
	uint32_t DestinationChannels,
	const float *pLevelMatrix,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETOUTPUTMATRIX,
		OperationSet
	);

	op->Data.SetOutputMatrix.pDestinationVoice = pDestinationVoice;
	op->Data.SetOutputMatrix.SourceChannels = SourceChannels;
	op->Data.SetOutputMatrix.DestinationChannels = DestinationChannels;
	op->Data.SetOutputMatrix.pLevelMatrix = voice->audio->pMalloc(
		sizeof(float) * SourceChannels * DestinationChannels
	);
	FAudio_memcpy(
		op->Data.SetOutputMatrix.pLevelMatrix,
		pLevelMatrix,
		sizeof(float) * SourceChannels * DestinationChannels
	);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}